

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenmesh::circumsphere
          (tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double *cent,double *radius)

{
  bool bVar1;
  double dVar2;
  int indx [4];
  double D;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_98;
  double local_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  int local_38 [4];
  double local_28;
  
  local_c0 = *pa;
  local_b8 = *pb - local_c0;
  local_70 = pa[1];
  local_b0 = pb[1] - local_70;
  dVar2 = pa[2];
  local_a8 = pb[2] - dVar2;
  local_98 = *pc - local_c0;
  local_90 = pc[1] - local_70;
  local_88 = pc[2] - dVar2;
  if (pd == (double *)0x0) {
    local_78 = local_b0 * local_88 - local_a8 * local_90;
    local_70 = -(local_88 * local_b8 - local_a8 * local_98);
    dVar2 = local_b0 * local_98;
    local_68 = local_90 * local_b8;
  }
  else {
    local_78 = *pd - local_c0;
    local_70 = pd[1] - local_70;
    local_68 = pd[2];
  }
  local_68 = local_68 - dVar2;
  local_e8 = (local_a8 * local_a8 + local_b8 * local_b8 + local_b0 * local_b0) * 0.5;
  local_e0 = (local_88 * local_88 + local_98 * local_98 + local_90 * local_90) * 0.5;
  if (pd == (double *)0x0) {
    local_d8 = 0.0;
  }
  else {
    local_d8 = (local_68 * local_68 + local_78 * local_78 + local_70 * local_70) * 0.5;
  }
  bVar1 = lu_decmp(this,(double (*) [4])&local_b8,3,local_38,&local_28,0);
  if (bVar1) {
    lu_solve(this,(double (*) [4])&local_b8,3,local_38,&local_e8,0);
    if (cent != (double *)0x0) {
      *cent = local_c0 + local_e8;
      cent[1] = pa[1] + local_e0;
      cent[2] = pa[2] + local_d8;
    }
    if (radius == (double *)0x0) {
      return bVar1;
    }
    dVar2 = local_d8 * local_d8 + local_e8 * local_e8 + local_e0 * local_e0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
  }
  else {
    dVar2 = 0.0;
    if (radius == (double *)0x0) {
      return bVar1;
    }
  }
  *radius = dVar2;
  return bVar1;
}

Assistant:

bool tetgenmesh::circumsphere(REAL* pa, REAL* pb, REAL* pc, REAL* pd, 
                              REAL* cent, REAL* radius)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];

  // Compute the coefficient matrix A (3x3).
  A[0][0] = pb[0] - pa[0];
  A[0][1] = pb[1] - pa[1];
  A[0][2] = pb[2] - pa[2];
  A[1][0] = pc[0] - pa[0];
  A[1][1] = pc[1] - pa[1];
  A[1][2] = pc[2] - pa[2];
  if (pd != NULL) {
    A[2][0] = pd[0] - pa[0];
    A[2][1] = pd[1] - pa[1]; 
    A[2][2] = pd[2] - pa[2];
  } else {
    cross(A[0], A[1], A[2]);
  }

  // Compute the right hand side vector b (3x1).
  rhs[0] = 0.5 * dot(A[0], A[0]);
  rhs[1] = 0.5 * dot(A[1], A[1]);
  if (pd != NULL) {
    rhs[2] = 0.5 * dot(A[2], A[2]);
  } else {
    rhs[2] = 0.0;
  }

  // Solve the 3 by 3 equations use LU decomposition with partial pivoting
  //   and backward and forward substitute..
  if (!lu_decmp(A, 3, indx, &D, 0)) {
    if (radius != (REAL *) NULL) *radius = 0.0;
    return false;
  }    
  lu_solve(A, 3, indx, rhs, 0);
  if (cent != (REAL *) NULL) {
    cent[0] = pa[0] + rhs[0];
    cent[1] = pa[1] + rhs[1];
    cent[2] = pa[2] + rhs[2];
  }
  if (radius != (REAL *) NULL) {
    *radius = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);
  }
  return true;
}